

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.h
# Opt level: O0

void __thiscall lf::mesh::hybrid2d::Mesh::~Mesh(Mesh *this)

{
  Mesh *this_local;
  
  (this->super_Mesh)._vptr_Mesh = (_func_int **)&PTR_DimMesh_00c5bcd8;
  std::array<std::vector<const_lf::mesh::Entity_*,_std::allocator<const_lf::mesh::Entity_*>_>,_3UL>
  ::~array(&this->entity_pointers_);
  std::vector<lf::mesh::hybrid2d::Quadrilateral,_std::allocator<lf::mesh::hybrid2d::Quadrilateral>_>
  ::~vector(&this->quads_);
  std::vector<lf::mesh::hybrid2d::Triangle,_std::allocator<lf::mesh::hybrid2d::Triangle>_>::~vector
            (&this->trias_);
  std::vector<lf::mesh::hybrid2d::Segment,_std::allocator<lf::mesh::hybrid2d::Segment>_>::~vector
            (&this->segments_);
  std::vector<lf::mesh::hybrid2d::Point,_std::allocator<lf::mesh::hybrid2d::Point>_>::~vector
            (&this->points_);
  mesh::Mesh::~Mesh(&this->super_Mesh);
  return;
}

Assistant:

[[nodiscard]] unsigned DimWorld() const override { return dim_world_; }